

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O1

complex<long_double> *
TPZMatrix<std::complex<long_double>_>::ReturnNearestValue
          (complex<long_double> *__return_storage_ptr__,complex<long_double> val,
          TPZVec<std::complex<long_double>_> *Vec,complex<long_double> tol)

{
  undefined8 *puVar1;
  complex<long_double> *pcVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  longdouble *plVar6;
  long lVar7;
  long lVar8;
  longdouble in_ST0;
  longdouble lVar9;
  longdouble lVar10;
  longdouble lVar11;
  longdouble in_ST1;
  longdouble lVar12;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble lVar13;
  longdouble lVar14;
  complex<long_double> diff0;
  undefined8 local_c8;
  undefined2 uStack_c0;
  undefined6 uStack_be;
  undefined8 local_b8;
  undefined2 uStack_b0;
  undefined6 uStack_ae;
  unkbyte10 local_a0;
  unkbyte10 local_94;
  longdouble local_88;
  longdouble local_7c;
  longdouble local_70;
  longdouble local_64;
  longdouble local_58;
  undefined4 uStack_4e;
  undefined2 uStack_4a;
  longdouble local_48;
  undefined4 uStack_3e;
  undefined2 uStack_3a;
  
  lVar11 = in_ST4;
  lVar13 = in_ST4;
  cabsl();
  cabsl();
  local_7c = val._M_value._0_10_;
  local_88 = val._M_value._16_10_;
  if (ABS(in_ST1) <= ABS(in_ST0)) {
    uStack_be = val._M_value._10_6_;
    uStack_ae = val._M_value._26_6_;
    lVar10 = local_7c - *(longdouble *)Vec->fStore->_M_value;
    lVar12 = local_88 - *(longdouble *)(Vec->fStore->_M_value + 0x10);
    local_c8 = SUB108(lVar10,0);
    uStack_c0 = (undefined2)((unkuint10)lVar10 >> 0x40);
  }
  else {
    local_c8 = SUB108((longdouble)1e+10,0);
    uStack_c0 = (undefined2)((unkuint10)(longdouble)1e+10 >> 0x40);
    lVar12 = (longdouble)0;
  }
  local_b8 = SUB108(lVar12,0);
  uStack_b0 = (undefined2)((unkuint10)lVar12 >> 0x40);
  pcVar2 = Vec->fStore;
  uVar3 = *(undefined8 *)pcVar2->_M_value;
  uVar4 = *(undefined8 *)(pcVar2->_M_value + 8);
  uVar5 = *(undefined8 *)(pcVar2->_M_value + 0x18);
  *(undefined8 *)(__return_storage_ptr__->_M_value + 0x10) =
       *(undefined8 *)(pcVar2->_M_value + 0x10);
  *(undefined8 *)(__return_storage_ptr__->_M_value + 0x18) = uVar5;
  *(undefined8 *)__return_storage_ptr__->_M_value = uVar3;
  *(undefined8 *)(__return_storage_ptr__->_M_value + 8) = uVar4;
  if (1 < Vec->fNElements) {
    local_94 = tol._M_value._0_10_;
    local_a0 = tol._M_value._16_10_;
    lVar8 = 1;
    lVar7 = 0;
    do {
      local_64 = local_7c - *(longdouble *)(Vec->fStore[1]._M_value + lVar7);
      local_70 = local_88 - *(longdouble *)(Vec->fStore[1]._M_value + lVar7 + 0x10);
      uStack_4a = val._M_value._14_2_;
      uStack_4e = val._M_value._10_4_;
      uStack_3a = val._M_value._30_2_;
      uStack_3e = val._M_value._26_4_;
      lVar12 = lVar13;
      lVar10 = lVar13;
      lVar14 = lVar13;
      local_58 = local_64;
      local_48 = local_70;
      cabsl();
      lVar9 = ABS(in_ST2);
      in_ST2 = in_ST4;
      in_ST4 = lVar13;
      lVar13 = lVar10;
      cabsl();
      lVar10 = ABS(in_ST3);
      plVar6 = (longdouble *)&local_c8;
      in_ST3 = lVar11;
      if (lVar10 <= lVar9) {
        in_ST3 = lVar12;
        lVar12 = lVar14;
        cabsl();
        lVar10 = ABS(in_ST2);
        in_ST2 = in_ST4;
        in_ST4 = lVar13;
        lVar13 = lVar14;
        cabsl();
        if (lVar10 < ABS(lVar11)) {
          puVar1 = (undefined8 *)(Vec->fStore[1]._M_value + lVar7);
          uVar3 = *puVar1;
          uVar4 = puVar1[1];
          puVar1 = (undefined8 *)(Vec->fStore[1]._M_value + lVar7 + 0x10);
          uVar5 = puVar1[1];
          *(undefined8 *)(__return_storage_ptr__->_M_value + 0x10) = *puVar1;
          *(undefined8 *)(__return_storage_ptr__->_M_value + 0x18) = uVar5;
          *(undefined8 *)__return_storage_ptr__->_M_value = uVar3;
          *(undefined8 *)(__return_storage_ptr__->_M_value + 8) = uVar4;
          plVar6 = &local_58;
        }
      }
      local_c8 = *(undefined8 *)plVar6;
      local_b8 = *(undefined8 *)(plVar6 + 1);
      uStack_b0 = (undefined2)*(undefined8 *)((long)plVar6 + 0x18);
      uStack_ae = (undefined6)((ulong)*(undefined8 *)((long)plVar6 + 0x18) >> 0x10);
      uStack_c0 = (undefined2)*(undefined8 *)((long)plVar6 + 8);
      uStack_be = (undefined6)((ulong)*(undefined8 *)((long)plVar6 + 8) >> 0x10);
      lVar8 = lVar8 + 1;
      lVar7 = lVar7 + 0x20;
      lVar11 = lVar12;
    } while (lVar8 < Vec->fNElements);
  }
  return __return_storage_ptr__;
}

Assistant:

TVar TPZMatrix<TVar>::ReturnNearestValue(TVar val, TPZVec<TVar>& Vec, TVar tol)
{
    TVar exps = val - (TVar)Vec[0];
    TVar diff0 = fabs(exps) >= fabs(tol) ?  (val - (TVar)Vec[0]) : (TVar)1.E10;
    TVar diff1, res = (TVar)Vec[0];
    for(int64_t i = 1; i < Vec.NElements(); i++)
    {
        diff1 = val - (TVar)Vec[i];
        diff0 = ( fabs(diff1) >= fabs(tol) && fabs(diff1) < fabs(diff0) ) ? res = Vec[i],diff1 : diff0;
    }
    return res;
}